

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_discover.cc
# Opt level: O1

int runDiscover(string *command,int argc,char **argv)

{
  uint64_t uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  pointer pDVar5;
  bool iponly;
  bool serialonly;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  DeviceInfo *extraout_RDX;
  DeviceInfo *extraout_RDX_00;
  DeviceInfo *extraout_RDX_01;
  DeviceInfo *extraout_RDX_02;
  DeviceInfo *extraout_RDX_03;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  __it2;
  DeviceInfo *info;
  iterator __first;
  pointer pDVar12;
  bool print_header;
  int iVar13;
  DeviceInfo *this;
  DeviceInfo *pDVar14;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  _Var15;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> infos;
  Discover discover;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> filtered_infos;
  DeviceFilter device_filter;
  int local_124;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_118;
  string *local_100;
  undefined1 local_f8 [48];
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_c8;
  DeviceFilter local_a8;
  
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  print_header = true;
  iVar13 = 0;
  serialonly = false;
  iponly = false;
  local_100 = command;
  while (iVar13 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,argv[iVar13],(allocator<char> *)&local_118);
    iVar13 = iVar13 + 1;
    iVar7 = std::__cxx11::string::compare((char *)local_f8);
    if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_f8), iVar7 == 0)) {
      bVar6 = true;
      print_header = false;
      iponly = true;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)local_f8);
      if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_f8), iVar7 == 0)) {
        bVar6 = true;
        print_header = false;
        serialonly = true;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)local_f8);
        if (iVar7 == 0) {
          iVar7 = parseFilterArguments(argc - iVar13,argv + iVar13,&local_a8);
          iVar13 = iVar13 + iVar7;
          bVar6 = true;
          print_header = false;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)local_f8);
          if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_f8), iVar7 == 0))
          {
            bVar6 = false;
            printHelp((ostream *)&std::cout,local_100);
            local_124 = 0;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid argument: ",0x12);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_f8._0_8_,local_f8._8_8_);
            local_118.
            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_118.
                                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_118,1);
            printHelp((ostream *)&std::cerr,local_100);
            local_124 = 1;
            bVar6 = false;
          }
        }
      }
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      (ulong)((long)&(((Socket<rcdiscover::SocketLinux> *)local_f8._16_8_)->
                                     iface_name_)._M_dataplus._M_p + 1));
    }
    if (!bVar6) goto LAB_0010df7f;
  }
  rcdiscover::Discover::Discover((Discover *)local_f8);
  rcdiscover::Discover::broadcastRequest((Discover *)local_f8);
  local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (DeviceInfo *)0x0;
  local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (DeviceInfo *)0x0;
  local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = std::chrono::_V2::steady_clock::now();
  lVar10 = lVar9;
  while ((bVar6 = rcdiscover::Discover::getResponse((Discover *)local_f8,&local_118,100),
         pDVar12 = local_118.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
         pDVar5 = local_118.
                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start, bVar6 ||
         ((double)(lVar10 - lVar9) / 1000000.0 < 1000.0))) {
    lVar10 = std::chrono::_V2::steady_clock::now();
  }
  __it2._M_current = extraout_RDX;
  if (local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar11 = (long)local_118.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_118.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 8;
    lVar10 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_118.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_118.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pDVar5,pDVar12);
    __it2._M_current = extraout_RDX_00;
  }
  __first._M_current =
       local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  _Var15._M_current =
       local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this = __first._M_current;
  if (local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pDVar14 = _Var15._M_current;
      _Var15._M_current = pDVar14 + 1;
      this = __first._M_current;
      if (_Var15._M_current == __first._M_current) break;
      bVar6 = __gnu_cxx::__ops::
              _Iter_comp_iter<runDiscover(std::__cxx11::string_const&,int,char**)::$_0>::operator()
                        (pDVar14,_Var15,__it2);
      __it2._M_current = extraout_RDX_01;
      this = pDVar14;
    } while (!bVar6);
  }
  if (this != __first._M_current) {
    _Var15._M_current = this + 2;
    for (; _Var15._M_current != __first._M_current; _Var15._M_current = _Var15._M_current + 1) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_comp_iter<runDiscover(std::__cxx11::string_const&,int,char**)::$_0>::operator()
                        (this,_Var15,__it2);
      __it2._M_current = extraout_RDX_02;
      pDVar14 = this;
      if (!bVar6) {
        pDVar14 = this + 1;
        std::__cxx11::string::operator=((string *)pDVar14,(string *)_Var15._M_current);
        iVar13 = (_Var15._M_current)->minor;
        uVar1 = (_Var15._M_current)->mac;
        uVar2 = *(undefined8 *)((long)&(_Var15._M_current)->mac + 4);
        uVar3 = (_Var15._M_current)->subnet;
        uVar4 = (_Var15._M_current)->gateway;
        this[1].major = (_Var15._M_current)->major;
        this[1].minor = iVar13;
        this[1].mac = uVar1;
        *(undefined8 *)((long)&this[1].mac + 4) = uVar2;
        this[1].subnet = uVar3;
        this[1].gateway = uVar4;
        std::__cxx11::string::operator=
                  ((string *)&this[1].manufacturer_name,
                   (string *)&(_Var15._M_current)->manufacturer_name);
        std::__cxx11::string::operator=
                  ((string *)&this[1].model_name,(string *)&(_Var15._M_current)->model_name);
        std::__cxx11::string::operator=
                  ((string *)&this[1].device_version,(string *)&(_Var15._M_current)->device_version)
        ;
        std::__cxx11::string::operator=
                  ((string *)&this[1].manufacturer_info,
                   (string *)&(_Var15._M_current)->manufacturer_info);
        std::__cxx11::string::operator=
                  ((string *)&this[1].serial_number,(string *)&(_Var15._M_current)->serial_number);
        std::__cxx11::string::operator=
                  ((string *)&this[1].user_name,(string *)&(_Var15._M_current)->user_name);
        __it2._M_current = extraout_RDX_03;
      }
      this = pDVar14;
    }
    __first._M_current = this + 1;
  }
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::_M_erase
            (&local_118,__first,
             (iterator)
             local_118.
             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pDVar5 = local_118.
           super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_118.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pDVar12 = local_118.
              super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if ((pDVar12->mac != 0) && (bVar6 = filterDevice(pDVar12,&local_a8), bVar6)) {
        std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
                  (&local_c8,pDVar12);
      }
      pDVar12 = pDVar12 + 1;
    } while (pDVar12 != pDVar5);
  }
  printDeviceTable((ostream *)&std::cout,&local_c8,print_header,iponly,serialonly);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(&local_c8);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(&local_118);
  rcdiscover::Discover::~Discover((Discover *)local_f8);
  local_124 = 0;
LAB_0010df7f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.model);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.iface);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.mac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.serial);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.name);
  return local_124;
}

Assistant:

int runDiscover(const std::string &command, int argc, char **argv)
{
  // interpret command line parameters

  bool printheader = true;
  bool iponly = false;
  bool serialonly = false;
  DeviceFilter device_filter;

  int i = 0;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-iponly" || p == "--iponly")
    {
      iponly = true;
      printheader = false;
    }
    else if (p == "-serialonly" || p == "--serialonly")
    {
      serialonly = true;
      printheader = false;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        return 1;
      }

      printheader = false;
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  // broadcast discover request

  rcdiscover::Discover discover;
  discover.broadcastRequest();

  std::vector<rcdiscover::DeviceInfo> infos;

  // get all responses, sort them and remove multiple entries

  std::chrono::steady_clock::time_point tstart=std::chrono::steady_clock::now();
  std::chrono::steady_clock::time_point tend=tstart;

  while (discover.getResponse(infos, 100) ||
    std::chrono::duration<double, std::milli>(tend-tstart).count() < 1000)
  {
    tend=std::chrono::steady_clock::now();
  }

  std::sort(infos.begin(), infos.end());
  const auto it = std::unique(infos.begin(), infos.end(),
                              [](const rcdiscover::DeviceInfo &lhs,
                                 const rcdiscover::DeviceInfo &rhs)
                              {
                                return lhs.getMAC() == rhs.getMAC() &&
                                       lhs.getIfaceName() == rhs.getIfaceName();
                              });
  infos.erase(it, infos.end());

  // go through all valid entries

  std::vector<rcdiscover::DeviceInfo> filtered_infos;
  for (rcdiscover::DeviceInfo &info : infos)
  {
    if (!info.isValid())
    {
      continue;
    }

    // filter as requested
    if (!filterDevice(info, device_filter)) continue;

    filtered_infos.push_back(info);
  }

  printDeviceTable(std::cout, filtered_infos, printheader, iponly, serialonly);

  return 0;
}